

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

bool __thiscall gl4cts::GetTextureSubImage::Errors::testTwoDimmensionalTextureErrors(Errors *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  GLsizei local_384;
  char *local_368;
  MessageBuilder local_360;
  uint local_1dc;
  int local_1d8;
  GLint is_proper_error_compressed;
  GLint error_value_1;
  GLuint i_1;
  MessageBuilder local_1b8;
  uint local_38;
  int local_34;
  GLint is_proper_error;
  GLint error_value;
  GLuint i;
  GLint is_error;
  Functions *gl;
  Errors *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _i = CONCAT44(extraout_var,iVar1);
  if ((testTwoDimmensionalTextureErrors()::test_textures == '\0') &&
     (iVar1 = __cxa_guard_acquire(&testTwoDimmensionalTextureErrors()::test_textures), iVar1 != 0))
  {
    testTwoDimmensionalTextureErrors::test_textures[0].id = this->m_texture_1D;
    testTwoDimmensionalTextureErrors::test_textures[0].target_name = "GL_TEXTURE_1D";
    testTwoDimmensionalTextureErrors::test_textures[1].id = this->m_texture_1D_array;
    testTwoDimmensionalTextureErrors::test_textures[1].target_name = "GL_TEXTURE_1D_ARRAY";
    testTwoDimmensionalTextureErrors::test_textures[2].id = this->m_texture_2D;
    testTwoDimmensionalTextureErrors::test_textures[2].target_name = "GL_TEXTURE_2D";
    __cxa_guard_release(&testTwoDimmensionalTextureErrors()::test_textures);
  }
  error_value = 1;
  for (is_proper_error = 0; (uint)is_proper_error < 3; is_proper_error = is_proper_error + 1) {
    if (testTwoDimmensionalTextureErrors::test_textures[(uint)is_proper_error].id == 0xde0) {
      local_384 = 1;
    }
    else {
      local_384 = 2;
    }
    (*this->m_gl_GetTextureSubImage)
              (testTwoDimmensionalTextureErrors::test_textures[(uint)is_proper_error].id,0,0,0,1,2,
               local_384,2,0x1908,0x1401,0x10,this->m_destination_buffer);
    local_34 = (**(code **)(_i + 0x800))();
    local_38 = (uint)(local_34 == 0x501);
    if (local_38 == 0) {
      error_value = 0;
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1b8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1b8,
                          (char (*) [103])
                          "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective target is "
                         );
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,&testTwoDimmensionalTextureErrors::test_textures
                                  [(uint)is_proper_error].target_name);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [128])
                                 " and either zoffset is not zero, or depth is not one. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                         );
      _error_value_1 = glu::getErrorName(local_34);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char **)&error_value_1);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])0x29dd1c0);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    }
  }
  if ((testTwoDimmensionalTextureErrors()::test_compressed_textures == '\0') &&
     (iVar1 = __cxa_guard_acquire(&testTwoDimmensionalTextureErrors()::test_compressed_textures),
     iVar1 != 0)) {
    testTwoDimmensionalTextureErrors::test_compressed_textures[0].id = this->m_texture_2D_compressed
    ;
    testTwoDimmensionalTextureErrors::test_compressed_textures[0].target_name = "GL_TEXTURE_2D";
    __cxa_guard_release(&testTwoDimmensionalTextureErrors()::test_compressed_textures);
  }
  for (is_proper_error_compressed = 0; is_proper_error_compressed == 0;
      is_proper_error_compressed = is_proper_error_compressed + 1) {
    (*this->m_gl_GetCompressedTextureSubImage)
              (testTwoDimmensionalTextureErrors::test_compressed_textures[0].id,0,0,0,1,4,4,2,0x10,
               this->m_destination_buffer);
    local_1d8 = (**(code **)(_i + 0x800))();
    local_1dc = (uint)(local_1d8 == 0x501);
    if (local_1dc == 0) {
      error_value = 0;
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_360,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_360,
                          (char (*) [113])
                          "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if the effective target is "
                         );
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,&testTwoDimmensionalTextureErrors::test_compressed_textures
                                  [(uint)is_proper_error_compressed].target_name);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [128])
                                 " and either zoffset is not zero, or depth is not one. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                         );
      local_368 = glu::getErrorName(local_1d8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_368);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [16])0x29dd1c0);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_360);
    }
  }
  return error_value != 0;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testTwoDimmensionalTextureErrors()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test. */
	static const struct
	{
		glw::GLuint		   id;
		const glw::GLchar* target_name;
	} test_textures[] = { { m_texture_1D, "GL_TEXTURE_1D" },
						  { m_texture_1D_array, "GL_TEXTURE_1D_ARRAY" },
						  { m_texture_2D, "GL_TEXTURE_2D" } };

	static const glw::GLuint test_textures_size = sizeof(test_textures) / sizeof(test_textures[0]);

	glw::GLint is_error = true;

	for (glw::GLuint i = 0; i < test_textures_size; ++i)
	{
		m_gl_GetTextureSubImage(test_textures[i].id, 0, 0, 0, 1, s_texture_data_width,
								(test_textures[i].id == GL_TEXTURE_1D) ? 1 : s_texture_data_height, 2, GL_RGBA,
								GL_UNSIGNED_BYTE, s_destination_buffer_size, m_destination_buffer);

		glw::GLint error_value	 = gl.getError();
		glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

		if (!is_proper_error)
		{
			is_error = false;

			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective"
				   " target is "
				<< test_textures[i].target_name << " and either zoffset is not zero, or depth"
												   " is not one. (OpenGL 4.5 Core Specification chapter 8.11.4)."
												   " However, the error value "
				<< glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
		}
	}

	/* Test (compressed textures). */
	static const struct
	{
		glw::GLuint		   id;
		const glw::GLchar* target_name;
	} test_compressed_textures[] = { { m_texture_2D_compressed, "GL_TEXTURE_2D" } };

	static const glw::GLuint test_compressed_textures_size =
		sizeof(test_compressed_textures) / sizeof(test_compressed_textures[0]);

	for (glw::GLuint i = 0; i < test_compressed_textures_size; ++i)
	{
		m_gl_GetCompressedTextureSubImage(test_compressed_textures[i].id, 0, 0, 0, 1, s_texture_data_compressed_width,
										  s_texture_data_compressed_height, 2, s_destination_buffer_size,
										  m_destination_buffer);

		glw::GLint error_value = gl.getError();

		glw::GLint is_proper_error_compressed = (GL_INVALID_VALUE == error_value);

		if (!is_proper_error_compressed)
		{
			is_error = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "GL_INVALID_VALUE error is expected to be generated by "
														   "glGetCompressedTextureSubImage if the effective"
														   " target is "
							   << test_compressed_textures[i].target_name
							   << " and either zoffset is not zero, or depth"
								  " is not one. (OpenGL 4.5 Core Specification chapter 8.11.4)."
								  " However, the error value "
							   << glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
		}
	}

	if (is_error)
	{
		return true;
	}

	return false;
}